

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
::GetNextIndex(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
               *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  
  if (this->freeCount == 0) {
    pTVar4 = &this->count;
  }
  else {
    if (this->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x291,"(freeCount > 0)","freeCount > 0");
      if (!bVar2) goto LAB_007cc56b;
      *puVar3 = 0;
    }
    if (this->freeList < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x292,"(freeList >= 0)","freeList >= 0");
      if (!bVar2) goto LAB_007cc56b;
      *puVar3 = 0;
    }
    pTVar4 = &this->freeList;
    if (this->count <= this->freeList) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x293,"(freeList < count)","freeList < count");
      if (!bVar2) {
LAB_007cc56b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return *pTVar4;
}

Assistant:

int GetNextIndex()
        {
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                return freeList;
            }

            return count;
        }